

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManArePrintUsed_rec(Gia_ManAre_t *p,Gia_PtrAre_t Root,int fTree)

{
  Gia_ObjAre_t *q;
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (ulong)(uint)Root;
  iVar5 = 0;
  while (fTree != 0) {
    lVar1 = *(long *)((long)p->ppObjs + (ulong)((uint)(uVar4 >> 0x11) & 0x3ff8));
    uVar4 = (ulong)(((uint)SUB84(uVar4,0) & 0xfffff) << 4);
    q = (Gia_ObjAre_t *)(uVar4 + lVar1);
    iVar2 = Gia_ObjHasBranch0(q);
    iVar2 = Gia_ManArePrintUsed_rec(p,*(Gia_PtrAre_t *)(lVar1 + 4 + uVar4),iVar2);
    iVar3 = Gia_ObjHasBranch1(q);
    iVar3 = Gia_ManArePrintUsed_rec(p,*(Gia_PtrAre_t *)(lVar1 + 8 + uVar4),iVar3);
    fTree = Gia_ObjHasBranch2(q);
    uVar4 = (ulong)*(uint *)(lVar1 + 0xc + uVar4);
    iVar5 = iVar2 + iVar5 + iVar3;
  }
  Gia_ManArePrintListUsed(p,SUB84(uVar4,0));
  return iVar5 + 1;
}

Assistant:

int Gia_ManArePrintUsed_rec( Gia_ManAre_t * p, Gia_PtrAre_t Root, int fTree )
{
    Gia_ObjAre_t * pObj;
    if ( !fTree )
        return Gia_ManArePrintListUsed( p, Root );
    pObj = Gia_ManAreObj(p, Root);
    return Gia_ManArePrintUsed_rec( p, pObj->F[0], Gia_ObjHasBranch0(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[1], Gia_ObjHasBranch1(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[2], Gia_ObjHasBranch2(pObj) );
}